

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIR.h
# Opt level: O1

void __thiscall
OpenMPVariantClause::setContextKind
          (OpenMPVariantClause *this,char *_score,OpenMPClauseContextKind _context_kind_name)

{
  allocator<char> local_71;
  long *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  undefined8 uStack_58;
  long *local_50;
  undefined8 local_48;
  long local_40;
  undefined8 uStack_38;
  OpenMPClauseContextKind local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,_score,&local_71);
  if (local_70 == (long *)&local_60) {
    uStack_38 = uStack_58;
    local_50 = &local_40;
  }
  else {
    local_50 = local_70;
  }
  local_40 = CONCAT71(uStack_5f,local_60);
  local_48 = local_68;
  local_68 = 0;
  local_60 = 0;
  local_70 = (long *)&local_60;
  local_30 = _context_kind_name;
  std::__cxx11::string::operator=((string *)&this->context_kind_name,(string *)&local_50);
  (this->context_kind_name).second = local_30;
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if (local_70 != (long *)&local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  return;
}

Assistant:

void setExtensionExpression(const char* _score, const char* _extension_expression) { extension_expression = std::make_pair(std::string(_score), std::string(_extension_expression)); }